

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O1

bool __thiscall ProfileData::Start(ProfileData *this,char *fname,Options *options)

{
  int iVar1;
  undefined1 extraout_AL;
  int iVar2;
  time_t tVar3;
  char *pcVar4;
  ProfileData *this_00;
  Slot *pSVar5;
  bool bVar6;
  
  if (this->out_ < 0) {
    iVar2 = open(fname,0x241,0x1b6);
    bVar6 = -1 < iVar2;
    if (bVar6) {
      tVar3 = time((time_t *)0x0);
      this->start_time_ = tVar3;
      pcVar4 = strdup(fname);
      this->fname_ = pcVar4;
      this->num_evicted_ = 0;
      this->count_ = 0;
      this->evictions_ = 0;
      this->total_bytes_ = 0;
      this_00 = (ProfileData *)operator_new__(0x800000);
      this->hash_ = (Bucket *)this_00;
      pSVar5 = (Slot *)operator_new__(0x200000);
      this->evict_ = pSVar5;
      memset(this_00,0,0x800000);
      this->num_evicted_ = 1;
      *pSVar5 = 0;
      this->num_evicted_ = 2;
      pSVar5[1] = 3;
      this->num_evicted_ = 3;
      pSVar5[2] = 0;
      iVar1 = options->frequency_;
      if (iVar1 == 0) {
        Start();
        Stop(this_00);
        return (bool)extraout_AL;
      }
      this->num_evicted_ = 4;
      pSVar5[3] = (long)(int)(1000000 / (long)iVar1);
      this->num_evicted_ = 5;
      pSVar5[4] = 0;
      this->out_ = iVar2;
      bVar6 = true;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ProfileData::Start(const char* fname,
                        const ProfileData::Options& options) {
  if (enabled()) {
    return false;
  }

  // Open output file and initialize various data structures
  int fd = open(fname, O_CREAT | O_WRONLY | O_TRUNC, 0666);
  if (fd < 0) {
    // Can't open outfile for write
    return false;
  }

  start_time_ = time(nullptr);
  fname_ = strdup(fname);

  // Reset counters
  num_evicted_ = 0;
  count_       = 0;
  evictions_   = 0;
  total_bytes_ = 0;

  hash_ = new Bucket[kBuckets];
  evict_ = new Slot[kBufferLength];
  memset(hash_, 0, sizeof(hash_[0]) * kBuckets);

  // Record special entries
  evict_[num_evicted_++] = 0;                     // count for header
  evict_[num_evicted_++] = 3;                     // depth for header
  evict_[num_evicted_++] = 0;                     // Version number
  CHECK_NE(0, options.frequency());
  int period = 1000000 / options.frequency();
  evict_[num_evicted_++] = period;                // Period (microseconds)
  evict_[num_evicted_++] = 0;                     // Padding

  out_ = fd;

  return true;
}